

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O2

void PPrintEndTag(TidyDocImpl *doc,uint mode,uint indent,Node *node)

{
  byte bVar1;
  int iVar2;
  uint c_00;
  uint uVar3;
  ulong in_RAX;
  TidyPrintImpl *pprint;
  undefined4 in_register_00000034;
  byte *str;
  undefined4 uStack_28;
  tchar c;
  
  iVar2 = *(int *)((doc->config).value + 0x55);
  pprint = &doc->pprint;
  str = *(byte **)(CONCAT44(in_register_00000034,mode) + 0x40);
  _uStack_28 = in_RAX;
  AddString(pprint,"</");
  if (str != (byte *)0x0) {
    while( true ) {
      bVar1 = *str;
      if (bVar1 == 0) break;
      _uStack_28 = (ulong)CONCAT14(bVar1,uStack_28);
      if ((char)bVar1 < '\0') {
        uVar3 = prvTidyGetUTF8((ctmbstr)str,&c);
        str = str + uVar3;
        c_00 = c;
      }
      else {
        c_00 = (uint)bVar1;
        if (iVar2 != 0) {
          c_00 = prvTidyToUpper((uint)bVar1);
          _uStack_28 = CONCAT44(c_00,uStack_28);
        }
      }
      AddChar(pprint,c_00);
      str = str + 1;
    }
  }
  AddChar(pprint,0x3e);
  return;
}

Assistant:

static void PPrintEndTag( TidyDocImpl* doc, uint ARG_UNUSED(mode),
                          uint ARG_UNUSED(indent), Node *node )
{
    TidyPrintImpl* pprint = &doc->pprint;
    Bool uc = cfgBool( doc, TidyUpperCaseTags );
    tmbstr s = node->element;
    tchar c;

    AddString( pprint, "</" );

    if (s)
    {
        while (*s)
        {
             c = (unsigned char)*s;

             if (c > 0x7F)
                 s += TY_(GetUTF8)(s, &c);
             else if (uc)
                 c = TY_(ToUpper)(c);

             AddChar(pprint, c);
             ++s;
        }
    }

    AddChar( pprint, '>' );
}